

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateManager.cpp
# Opt level: O1

int __thiscall helics::MessageFederateManager::getEndpointCount(MessageFederateManager *this)

{
  bool bVar1;
  size_t sVar2;
  pthread_rwlock_t *__rwlock;
  
  bVar1 = (this->mLocalEndpoints).enabled;
  if (bVar1 == true) {
    __rwlock = (pthread_rwlock_t *)&(this->mLocalEndpoints).m_mutex;
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)&__rwlock->__data);
  }
  else {
    __rwlock = (pthread_rwlock_t *)0x0;
  }
  sVar2 = (this->mLocalEndpoints).m_obj.dataStorage.csize;
  if (bVar1 != false) {
    pthread_rwlock_unlock(__rwlock);
  }
  return (int)sVar2;
}

Assistant:

int MessageFederateManager::getEndpointCount() const
{
    return static_cast<int>(mLocalEndpoints.lock_shared()->size());
}